

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

df_solver_t * __thiscall
tchecker::clockbounds::df_solver_t::operator=(df_solver_t *this,df_solver_t *solver)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  db_t *pdVar4;
  df_solver_t *solver_local;
  df_solver_t *this_local;
  
  if (this != solver) {
    this->_loc_number = solver->_loc_number;
    this->_clock_number = solver->_clock_number;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->_loc_pid,&solver->_loc_pid);
    this->_dim = solver->_dim;
    if (this->_L != (db_t *)0x0) {
      operator_delete__(this->_L);
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->_dim * this->_dim;
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pdVar4 = (db_t *)operator_new__(uVar3);
    this->_L = pdVar4;
    memcpy(this->_L,solver->_L,this->_dim * this->_dim * 4);
    if (this->_U != (db_t *)0x0) {
      operator_delete__(this->_U);
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = this->_dim * this->_dim;
    uVar3 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pdVar4 = (db_t *)operator_new__(uVar3);
    this->_U = pdVar4;
    memcpy(this->_U,solver->_U,this->_dim * this->_dim * 4);
    this->_updated_L = (bool)(solver->_updated_L & 1);
    this->_updated_U = (bool)(solver->_updated_U & 1);
  }
  return this;
}

Assistant:

tchecker::clockbounds::df_solver_t & df_solver_t::operator=(tchecker::clockbounds::df_solver_t const & solver)
{
  if (this != &solver) {
    _loc_number = solver._loc_number;
    _clock_number = solver._clock_number;
    _loc_pid = solver._loc_pid;
    _dim = solver._dim;

    delete[] _L;
    _L = new tchecker::dbm::db_t[_dim * _dim];
    memcpy(_L, solver._L, _dim * _dim * sizeof(*_L));

    delete[] _U;
    _U = new tchecker::dbm::db_t[_dim * _dim];
    memcpy(_U, solver._U, _dim * _dim * sizeof(*_U));

    _updated_L = solver._updated_L;
    _updated_U = solver._updated_U;
  }

  return *this;
}